

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O1

int SUNLinSolSpace_SPTFQMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  N_Vector v;
  sunindextype lrw1;
  sunindextype liw1;
  sunindextype local_20;
  sunindextype local_18;
  
  v = *(N_Vector *)((long)S->content + 0x90);
  if (v->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    N_VSpace(v,&local_20,&local_18);
  }
  *lenrwLS = local_20 * 0xb;
  *leniwLS = local_18 * 0xb;
  return 0;
}

Assistant:

int SUNLinSolSpace_SPTFQMR(SUNLinearSolver S, 
                           long int *lenrwLS, 
                           long int *leniwLS)
{
  sunindextype liw1, lrw1;
  if (SPTFQMR_CONTENT(S)->vtemp1->ops->nvspace)
    N_VSpace(SPTFQMR_CONTENT(S)->vtemp1, &lrw1, &liw1);
  else
    lrw1 = liw1 = 0;
  *lenrwLS = lrw1*11;
  *leniwLS = liw1*11;
  return(SUNLS_SUCCESS);
}